

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void push_scope(Context_conflict *ctx)

{
  Context_conflict *ctx_local;
  
  push_usertype(ctx,(char *)0x0,(MOJOSHADER_astDataType *)0x0);
  push_variable(ctx,(char *)0x0,(MOJOSHADER_astDataType *)0x0);
  return;
}

Assistant:

static inline void push_scope(Context *ctx)
{
    push_usertype(ctx, NULL, NULL);
    push_variable(ctx, NULL, NULL);
}